

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SetTextEncoding(sqlite3 *db,u8 enc)

{
  CollSeq *pCVar1;
  
  db->enc = enc;
  pCVar1 = sqlite3FindCollSeq(db,enc,"BINARY",0);
  db->pDfltColl = pCVar1;
  sqlite3ExpirePreparedStatements(db,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SetTextEncoding(sqlite3 *db, u8 enc){
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  db->enc = enc;
  /* EVIDENCE-OF: R-08308-17224 The default collating function for all
  ** strings is BINARY.
  */
  db->pDfltColl = sqlite3FindCollSeq(db, enc, sqlite3StrBINARY, 0);
  sqlite3ExpirePreparedStatements(db, 1);
}